

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase61::run(TestCase61 *this)

{
  long lVar1;
  undefined8 *puVar2;
  long *pointer;
  long *plVar3;
  char *this_00;
  Nested *ptrCopy;
  bool destroyed2;
  bool destroyed1;
  bool _kjCondition_3;
  DebugExpression<bool> _kjCondition_2;
  DebugExpression<bool> _kjCondition;
  DebugExpression<bool_&> _kjCondition_1;
  byte local_35;
  bool local_34;
  bool local_33;
  DebugExpression<bool> local_32;
  DebugExpression<bool> local_31;
  DebugExpression<bool_&> local_30;
  
  local_34 = false;
  local_35 = 0;
  pointer = (long *)operator_new(0x18);
  *pointer = (long)&local_34;
  pointer[1] = 0;
  pointer[2] = 0;
  plVar3 = (long *)operator_new(0x18);
  *plVar3 = (long)&local_35;
  plVar3[1] = 0;
  plVar3[2] = 0;
  this_00 = (char *)pointer[1];
  lVar1 = pointer[2];
  pointer[1] = (long)&_::HeapDisposer<kj::(anonymous_namespace)::Nested>::instance;
  pointer[2] = (long)plVar3;
  if (lVar1 != 0) {
    (**(((HeapDisposer<kj::(anonymous_namespace)::Nested> *)this_00)->super_Disposer)._vptr_Disposer
    )();
  }
  local_31.value = (bool)0;
  if (local_34 == false) {
    local_31.value = (bool)(local_35 ^ 1);
  }
  if (((local_31.value & 1U) == 0) && (_::Debug::minSeverity < 3)) {
    this_00 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
    ;
    _::Debug::log<char_const(&)[45],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x41,ERROR,"\"failed: expected \" \"!(destroyed1 || destroyed2)\", _kjCondition",
               (char (*) [45])"failed: expected !(destroyed1 || destroyed2)",&local_31);
  }
  puVar2 = (undefined8 *)pointer[1];
  lVar1 = pointer[2];
  pointer[2] = 0;
  _::HeapDisposer<kj::(anonymous_namespace)::Nested>::disposeImpl
            ((HeapDisposer<kj::(anonymous_namespace)::Nested> *)this_00,pointer);
  local_30.value = &local_34;
  if ((local_34 == false) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[28],kj::_::DebugExpression<bool&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x43,ERROR,"\"failed: expected \" \"destroyed1\", _kjCondition",
               (char (*) [28])"failed: expected destroyed1",&local_30);
  }
  local_32.value = (bool)(local_35 ^ 1);
  if ((local_35 != 0) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[31],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x44,ERROR,"\"failed: expected \" \"!(destroyed2)\", _kjCondition",
               (char (*) [31])"failed: expected !(destroyed2)",&local_32);
  }
  if (lVar1 != 0) {
    (**(code **)*puVar2)(puVar2,lVar1);
  }
  local_33 = (bool)(local_35 & local_34);
  if ((local_33 == false) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[42],bool&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x46,ERROR,"\"failed: expected \" \"destroyed1 && destroyed2\", _kjCondition",
               (char (*) [42])"failed: expected destroyed1 && destroyed2",&local_33);
  }
  return;
}

Assistant:

TEST(Memory, AssignNested) {
  bool destroyed1 = false, destroyed2 = false;
  auto nested = heap<Nested>(destroyed1);
  nested->nested = heap<Nested>(destroyed2);
  EXPECT_FALSE(destroyed1 || destroyed2);
  nested = kj::mv(nested->nested);
  EXPECT_TRUE(destroyed1);
  EXPECT_FALSE(destroyed2);
  nested = nullptr;
  EXPECT_TRUE(destroyed1 && destroyed2);
}